

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nwkDfs.c
# Opt level: O1

Vec_Ptr_t * Nwk_ManSupportNodes(Nwk_Man_t *pNtk,Nwk_Obj_t **ppNodes,int nNodes)

{
  Vec_Ptr_t *vNodes;
  void **ppvVar1;
  Nwk_Obj_t *pNode;
  ulong uVar2;
  
  Nwk_ManIncrementTravId(pNtk);
  vNodes = (Vec_Ptr_t *)malloc(0x10);
  vNodes->nCap = 100;
  vNodes->nSize = 0;
  ppvVar1 = (void **)malloc(800);
  vNodes->pArray = ppvVar1;
  if (0 < nNodes) {
    uVar2 = 0;
    do {
      pNode = ppNodes[uVar2];
      if ((*(uint *)&pNode->field_0x20 & 7) == 2) {
        pNode = *pNode->pFanio;
      }
      Nwk_ManSupportNodes_rec(pNode,vNodes);
      uVar2 = uVar2 + 1;
    } while ((uint)nNodes != uVar2);
  }
  return vNodes;
}

Assistant:

Vec_Ptr_t * Nwk_ManSupportNodes( Nwk_Man_t * pNtk, Nwk_Obj_t ** ppNodes, int nNodes )
{
    Vec_Ptr_t * vNodes;
    int i;
    // set the traversal ID
    Nwk_ManIncrementTravId( pNtk );
    // start the array of nodes
    vNodes = Vec_PtrAlloc( 100 );
    // go through the PO nodes and call for each of them
    for ( i = 0; i < nNodes; i++ )
        if ( Nwk_ObjIsCo(ppNodes[i]) )
            Nwk_ManSupportNodes_rec( Nwk_ObjFanin0(ppNodes[i]), vNodes );
        else
            Nwk_ManSupportNodes_rec( ppNodes[i], vNodes );
    return vNodes;
}